

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

reentrant_put_transaction<void> *
density_tests::detail::
ReentrantPush<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  uint32_t val;
  reentrant_put_transaction<unsigned_int> transaction;
  uint local_8c;
  reentrant_put_transaction<unsigned_int> local_88;
  reentrant_put_transaction<unsigned_int> local_68;
  reentrant_put_transaction<unsigned_int> local_48;
  
  local_8c = 0x20;
  density::
  lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
  ::start_reentrant_emplace<unsigned_int,unsigned_int&>
            (&local_48,
             (lf_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,(density::consistency_model)1>
              *)i_queue,&local_8c);
  local_68.m_put.m_user_storage = local_48.m_put.m_user_storage;
  local_68.m_put.m_control_block = local_48.m_put.m_control_block;
  local_68.m_put.m_next_ptr = local_48.m_put.m_next_ptr;
  local_68.m_queue = local_48.m_queue;
  local_48.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_48);
  local_88.m_put.m_control_block = local_68.m_put.m_control_block;
  local_88.m_put.m_next_ptr = local_68.m_put.m_next_ptr;
  local_88.m_put.m_user_storage = local_68.m_put.m_user_storage;
  local_88.m_queue = local_48.m_queue;
  local_68.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_68);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_88.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_88.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_88.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_48.m_queue;
  local_88.m_put.m_user_storage = (void *)0x0;
  density::
  lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_put_transaction<unsigned_int>::~reentrant_put_transaction(&local_88);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                uint32_t val         = 32;
                auto     transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }